

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

ExpressionValue * __thiscall
ExpressionValue::operator-(ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValue *result;
  ExpressionValue *in_RDI;
  double dVar1;
  
  (in_RDI->strValue)._value._M_dataplus._M_p = (pointer)&(in_RDI->strValue)._value.field_2;
  (in_RDI->strValue)._value._M_string_length = 0;
  (in_RDI->strValue)._value.field_2._M_local_buf[0] = '\0';
  in_RDI->type = Invalid;
  (in_RDI->field_1).intValue = 0;
  switch(this->type << 2 | other->type) {
  case 5:
    in_RDI->type = Integer;
    (in_RDI->field_1).intValue = (this->field_1).intValue - (other->field_1).intValue;
    return in_RDI;
  case 6:
    in_RDI->type = Float;
    dVar1 = (double)(this->field_1).intValue;
    break;
  default:
    goto switchD_00178fb4_caseD_7;
  case 9:
    in_RDI->type = Float;
    dVar1 = (this->field_1).floatValue - (double)(other->field_1).intValue;
    goto LAB_00178ffe;
  case 10:
    in_RDI->type = Float;
    dVar1 = (this->field_1).floatValue;
  }
  dVar1 = dVar1 - (other->field_1).floatValue;
LAB_00178ffe:
  (in_RDI->field_1).floatValue = dVar1;
switchD_00178fb4_caseD_7:
  return in_RDI;
}

Assistant:

ExpressionValue ExpressionValue::operator-(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		result.intValue = intValue - other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue - other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.type = ExpressionValueType::Float;
		result.floatValue = intValue - other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue - other.floatValue;
		break;
	default:
		break;
	}

	return result;
}